

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O1

bool __thiscall
soplex::SPxSolverBase<double>::enter(SPxSolverBase<double> *this,SPxId *enterId,bool polish)

{
  bool bVar1;
  SSVectorBase<double> *pSVar2;
  SSVectorBase<double> *pSVar3;
  pointer pUVar4;
  SLinSolver<double> *pSVar5;
  pointer pdVar6;
  pointer pdVar7;
  Item *pIVar8;
  SVectorBase<double> *pSVar9;
  Real RVar10;
  double dVar11;
  LPRowSetBase<double> *pLVar12;
  int iVar13;
  uint uVar14;
  undefined4 extraout_var;
  long lVar15;
  double *pdVar16;
  SPxOut *pSVar17;
  _func_int **pp_Var18;
  uint uVar19;
  SVectorBase<double> *pSVar20;
  long lVar21;
  undefined7 in_register_00000011;
  int *piVar22;
  DataKey *pDVar23;
  DataKey DVar24;
  ulong uVar25;
  SSVectorBase<double> *pSVar26;
  SSVectorBase<double> *pSVar27;
  ulong uVar28;
  double dVar29;
  UpdateVector<double> *pUVar30;
  bool bVar31;
  undefined4 uVar32;
  Status enterStat;
  DataKey *local_110;
  SVectorBase<double> *local_108;
  undefined8 uStack_100;
  double leavebound;
  double local_e8;
  undefined8 uStack_e0;
  double enterTest;
  double leaveVal;
  undefined4 local_bc;
  SPxId none;
  double enterMax;
  double enterVal;
  double enterPric;
  StableSum<double> objChange;
  double enterRO;
  SSVectorBase<double> *local_68;
  double enterLB;
  double enterUB;
  
  none.super_DataKey.info = 0;
  none.super_DataKey.idx = -1;
  objChange.sum = 0.0;
  objChange.c = 0.0;
  iVar13 = (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
             super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7e])();
  local_108 = (SVectorBase<double> *)CONCAT44(extraout_var,iVar13);
  bVar1 = this->instableEnter;
  local_110 = &enterId->super_DataKey;
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x81])
            (this,enterId->super_DataKey,&enterTest,&enterUB,&enterLB,&enterVal,&enterMax,&enterPric
             ,&enterStat,&enterRO,&objChange);
  if ((int)CONCAT71(in_register_00000011,polish) == 0) {
    local_e8 = enterTest;
    RVar10 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    if (local_e8 <= -RVar10) goto LAB_001f204a;
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x84])
              (SUB84(enterTest,0),this,*local_110,(ulong)(uint)enterStat);
    pp_Var18 = (this->super_SPxBasisBase<double>)._vptr_SPxBasisBase;
    bVar31 = false;
  }
  else {
LAB_001f204a:
    pUVar30 = this->theFvec;
    if (((pUVar30->thedelta).setupStatus == true) && ((pUVar30->thedelta).super_IdxSet.num == 0)) {
      SPxBasisBase<double>::solve4update
                (&this->super_SPxBasisBase<double>,&pUVar30->thedelta,local_108);
    }
    if ((!polish) && (this->m_maxCycle < this->m_numCycle)) {
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[(ulong)(enterMax < 0.0) + 0x89])
                (this);
    }
    leaveVal = -enterMax;
    this->boundflips = 0;
    uVar14 = (*this->theratiotester->_vptr_SPxRatioTester[7])
                       (SUB84(enterTest,0),this->theratiotester,&leaveVal,polish);
    this->instableEnterVal = 0.0;
    (this->instableEnterId).super_DataKey = (DataKey)0xffffffff00000000;
    this->instableEnter = false;
    bVar31 = -1 < (int)uVar14;
    if (bVar31) {
      local_e8 = ABS(leaveVal);
      uStack_e0 = 0;
      dVar11 = entertol(this);
      dVar29 = (double)(ulong)uVar14;
      if (dVar11 <= local_e8) {
        this->m_numCycle = this->m_numCycle / 2;
      }
      else {
        local_e8 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)dVar29] -
                   (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)dVar29];
        uStack_e0 = 0;
        RVar10 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        if (((RVar10 < ABS(local_e8)) && (enterStat != P_FREE)) && (enterStat != D_FREE)) {
          this->m_numCycle = this->m_numCycle + 1;
          this->enterCycles = this->enterCycles + 1;
        }
      }
      pSVar26 = this->coSolveVector3;
      local_e8 = dVar29;
      if (pSVar26 == (SSVectorBase<double> *)0x0) {
LAB_001f25af:
        pSVar26 = this->coSolveVector2;
        if (pSVar26 == (SSVectorBase<double> *)0x0) {
          SPxBasisBase<double>::coSolve
                    (&this->super_SPxBasisBase<double>,&this->theCoPvec->thedelta,
                     &(this->unitVecs).data.
                      super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)dVar29].
                      super_SVectorBase<double>);
        }
        else {
          pUVar30 = this->theCoPvec;
          pSVar2 = this->coSolveVector2rhs;
          pUVar4 = (this->unitVecs).data.
                   super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((this->super_SPxBasisBase<double>).factorized == false) {
            SPxBasisBase<double>::factorize(&this->super_SPxBasisBase<double>);
          }
          pSVar5 = (this->super_SPxBasisBase<double>).factor;
          (*pSVar5->_vptr_SLinSolver[0x18])
                    (pSVar5,&pUVar30->thedelta,pSVar26,pUVar4 + (long)dVar29,pSVar2);
          dVar29 = local_e8;
        }
      }
      else {
        pSVar2 = this->coSolveVector2;
        if (pSVar2 == (SSVectorBase<double> *)0x0) {
          if (pSVar26 == (SSVectorBase<double> *)0x0) goto LAB_001f25af;
          pUVar30 = this->theCoPvec;
          pSVar2 = this->coSolveVector3rhs;
          pUVar4 = (this->unitVecs).data.
                   super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((this->super_SPxBasisBase<double>).factorized == false) {
            SPxBasisBase<double>::factorize(&this->super_SPxBasisBase<double>);
          }
          pSVar5 = (this->super_SPxBasisBase<double>).factor;
          (*pSVar5->_vptr_SLinSolver[0x18])
                    (pSVar5,&pUVar30->thedelta,pSVar26,pUVar4 + (long)dVar29,pSVar2);
          pSVar26 = this->coSolveVector3;
          pUVar30 = this->theCoPvec;
          dVar29 = local_e8;
          if (pSVar26->setupStatus == true) {
            lVar15 = (long)(pSVar26->super_IdxSet).num;
            if (0 < lVar15) {
              piVar22 = (pSVar26->super_IdxSet).idx;
              pdVar6 = (pSVar26->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar7 = (pUVar30->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar15 = lVar15 + 1;
              do {
                iVar13 = piVar22[lVar15 + -2];
                pdVar7[iVar13] = pdVar7[iVar13] - pdVar6[iVar13];
                lVar15 = lVar15 + -1;
              } while (1 < lVar15);
            }
          }
          else {
            pdVar6 = (pUVar30->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar19 = (uint)((ulong)((long)(pUVar30->super_VectorBase<double>).val.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6)
                           >> 3);
            if (0 < (int)uVar19) {
              pdVar7 = (pSVar26->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar15 = (ulong)(uVar19 & 0x7fffffff) + 1;
              do {
                pdVar6[lVar15 + 0xfffffffffffffffe] =
                     pdVar6[lVar15 + 0xfffffffffffffffe] - pdVar7[lVar15 + -2];
                lVar15 = lVar15 + -1;
              } while (1 < lVar15);
            }
          }
        }
        else {
          pUVar30 = this->theCoPvec;
          pSVar3 = this->coSolveVector2rhs;
          pUVar4 = (this->unitVecs).data.
                   super__Vector_base<soplex::UnitVectorBase<double>,_std::allocator<soplex::UnitVectorBase<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pSVar27 = this->coSolveVector3rhs;
          if ((this->super_SPxBasisBase<double>).factorized == false) {
            local_68 = this->coSolveVector3rhs;
            SPxBasisBase<double>::factorize(&this->super_SPxBasisBase<double>);
            pSVar27 = local_68;
          }
          pSVar5 = (this->super_SPxBasisBase<double>).factor;
          (*pSVar5->_vptr_SLinSolver[0x1a])
                    (pSVar5,&pUVar30->thedelta,pSVar2,pSVar26,pUVar4 + (long)dVar29,pSVar3,pSVar27);
          pSVar26 = this->coSolveVector3;
          pUVar30 = this->theCoPvec;
          dVar29 = local_e8;
          if (pSVar26->setupStatus == true) {
            lVar15 = (long)(pSVar26->super_IdxSet).num;
            if (0 < lVar15) {
              piVar22 = (pSVar26->super_IdxSet).idx;
              pdVar6 = (pSVar26->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar7 = (pUVar30->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar15 = lVar15 + 1;
              do {
                iVar13 = piVar22[lVar15 + -2];
                pdVar7[iVar13] = pdVar7[iVar13] - pdVar6[iVar13];
                lVar15 = lVar15 + -1;
              } while (1 < lVar15);
            }
          }
          else {
            pdVar6 = (pUVar30->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar19 = (uint)((ulong)((long)(pUVar30->super_VectorBase<double>).val.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar6)
                           >> 3);
            if (0 < (int)uVar19) {
              pdVar7 = (pSVar26->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              lVar15 = (ulong)(uVar19 & 0x7fffffff) + 1;
              do {
                pdVar6[lVar15 + 0xfffffffffffffffe] =
                     pdVar6[lVar15 + 0xfffffffffffffffe] - pdVar7[lVar15 + -2];
                lVar15 = lVar15 + -1;
              } while (1 < lVar15);
            }
          }
        }
      }
      pSVar20 = local_108;
      pDVar23 = local_110;
      if (0 < this->boundflips) {
        uVar19 = (uint)((ulong)((long)(this->coSolveVector3->super_VectorBase<double>).val.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)(this->coSolveVector3->super_VectorBase<double>).val.
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 3);
        if (0 < (int)uVar19) {
          uVar25 = (ulong)(uVar19 & 0x7fffffff);
          do {
            uVar28 = uVar25 - 1;
            local_108 = (SVectorBase<double> *)
                        ((ulong)(this->coSolveVector3->super_VectorBase<double>).val.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start[uVar25 - 1] & 0x7fffffffffffffff);
            uStack_100 = 0;
            RVar10 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr);
            if (RVar10 < (double)local_108) {
              pIVar8 = (this->thecovectors->set).theitem;
              iVar13 = (this->thecovectors->set).thekey[uVar28].idx;
              lVar15 = (long)pIVar8[iVar13].data.super_SVectorBase<double>.memused;
              if (0 < lVar15) {
                dVar11 = (this->coSolveVector3->super_VectorBase<double>).val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar28];
                pdVar6 = (this->thePvec->super_VectorBase<double>).val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar21 = lVar15 + 1;
                piVar22 = &pIVar8[iVar13].data.super_SVectorBase<double>.m_elem[lVar15 + -1].idx;
                do {
                  pdVar6[*piVar22] =
                       pdVar6[*piVar22] - ((Nonzero<double> *)(piVar22 + -2))->val * dVar11;
                  lVar21 = lVar21 + -1;
                  piVar22 = piVar22 + -4;
                } while (1 < lVar21);
              }
            }
            bVar1 = 1 < (long)uVar25;
            uVar25 = uVar28;
          } while (bVar1);
        }
        if (pDVar23->info < 1) {
          pUVar30 = this->thePvec;
          SPxRowId::SPxRowId((SPxRowId *)&leavebound,(SPxId *)pDVar23);
          pLVar12 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>;
        }
        else {
          pUVar30 = this->theCoPvec;
          SPxColId::SPxColId((SPxColId *)&leavebound,(SPxId *)pDVar23);
          pLVar12 = (LPRowSetBase<double> *)
                    &(this->super_SPxLPBase<double>).super_LPColSetBase<double>;
        }
        iVar13 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                           (&(pLVar12->super_SVSetBase<double>).set,(DataKey *)&leavebound);
        enterPric = (pUVar30->super_VectorBase<double>).val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar13];
        this->totalboundflips = this->totalboundflips + this->boundflips;
        dVar29 = local_e8;
      }
      (this->theCoPrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[(long)dVar29] = enterRO;
      local_108 = (SVectorBase<double> *)
                  ((enterRO - enterPric) /
                  (this->theFvec->thedelta).super_VectorBase<double>.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)dVar29]);
      this->theCoPvec->theval = (double)local_108;
      RVar10 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if (RVar10 < (double)local_108) {
LAB_001f2941:
        if (this->thePricing == FULL) {
          this->thePvec->theval = this->theCoPvec->theval;
          (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
            super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x86])(this);
        }
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x87])(this);
      }
      else {
        local_108 = (SVectorBase<double> *)this->theCoPvec->theval;
        RVar10 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        if ((double)local_108 < -RVar10) goto LAB_001f2941;
      }
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x82])
                (enterMax._0_4_,this,uVar14,&leavebound,&objChange);
      (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[(long)dVar29] = enterUB;
      (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[(long)dVar29] = enterLB;
      updateCoTest(this);
      if (this->thePricing == FULL) {
        updateTest(this);
      }
      pUVar30 = this->theFvec;
      pUVar30->theval = leaveVal;
      UpdateVector<double>::update(pUVar30);
      (this->theFvec->super_VectorBase<double>).val.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [(long)dVar29] = enterVal - leaveVal;
      local_108 = (SVectorBase<double> *)CONCAT44(leavebound._4_4_,leavebound._0_4_);
      RVar10 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if (RVar10 < (double)local_108) {
LAB_001f2a64:
        pSVar9 = (this->super_SPxBasisBase<double>).matrix.data[(long)dVar29];
        lVar15 = (long)pSVar9->memused;
        if (0 < lVar15) {
          pdVar6 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar21 = lVar15 + 1;
          piVar22 = &pSVar9->m_elem[lVar15 + -1].idx;
          do {
            pdVar6[*piVar22] =
                 pdVar6[*piVar22] -
                 ((Nonzero<double> *)(piVar22 + -2))->val *
                 (double)CONCAT44(leavebound._4_4_,leavebound._0_4_);
            lVar21 = lVar21 + -1;
            piVar22 = piVar22 + -4;
          } while (1 < lVar21);
        }
      }
      else {
        local_108 = (SVectorBase<double> *)CONCAT44(leavebound._4_4_,leavebound._0_4_);
        RVar10 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        if ((double)local_108 < -RVar10) goto LAB_001f2a64;
      }
      local_108 = (SVectorBase<double> *)enterVal;
      RVar10 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      if (RVar10 < (double)local_108) {
LAB_001f2b13:
        lVar15 = (long)pSVar20->memused;
        if (0 < lVar15) {
          pdVar6 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar21 = lVar15 + 1;
          piVar22 = &pSVar20->m_elem[lVar15 + -1].idx;
          do {
            pdVar6[*piVar22] =
                 enterVal * ((Nonzero<double> *)(piVar22 + -2))->val + pdVar6[*piVar22];
            lVar21 = lVar21 + -1;
            piVar22 = piVar22 + -4;
          } while (1 < lVar21);
        }
      }
      else {
        local_108 = (SVectorBase<double> *)enterVal;
        RVar10 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
        if ((double)local_108 < -RVar10) goto LAB_001f2b13;
      }
      if (this->m_nonbasicValueUpToDate == true) {
        this->m_nonbasicValue = objChange.sum + objChange.c + this->m_nonbasicValue;
        nonbasicValue(this);
      }
      pSVar26 = &this->theFvec->thedelta;
      pp_Var18 = (this->super_SPxBasisBase<double>)._vptr_SPxBasisBase;
      uVar25 = (ulong)uVar14;
      goto LAB_001f2bb7;
    }
    local_e8 = leaveVal + enterMax;
    uStack_e0 = 0;
    RVar10 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
    if (ABS(local_e8) <= RVar10) {
      if (!polish) {
        local_e8 = leaveVal;
        ::soplex::infinity::__tls_init();
        pdVar16 = (double *)__tls_get_addr(&PTR_003b6b60);
        dVar11 = leaveVal;
        if (local_e8 < *pdVar16) {
          uStack_e0 = 0;
          local_e8 = *pdVar16;
          ::soplex::infinity::__tls_init();
          pSVar20 = local_108;
          pDVar23 = local_110;
          if (-local_e8 < dVar11) {
            (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                      (&this->super_SPxBasisBase<double>,0xffffffff,local_110,local_108,0);
            pUVar30 = this->theFvec;
            pUVar30->theval = leaveVal;
            UpdateVector<double>::update(pUVar30);
            (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x83])
                      (SUB84(leaveVal,0),this,*pDVar23,(ulong)(uint)enterStat,pSVar20,&objChange);
            if (this->m_nonbasicValueUpToDate != true) {
              return bVar31;
            }
            this->m_nonbasicValue = objChange.sum + objChange.c + this->m_nonbasicValue;
            nonbasicValue(this);
            return bVar31;
          }
        }
      }
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x84])
                (SUB84(enterTest,0),this,*local_110,(ulong)(uint)enterStat);
      (**(this->super_SPxBasisBase<double>)._vptr_SPxBasisBase)
                (&this->super_SPxBasisBase<double>,0xffffffff,&none,0,0);
      if (polish) {
        return bVar31;
      }
      if (1 < (this->super_SPxBasisBase<double>).updateCount) {
        pSVar17 = this->spxout;
        if ((pSVar17 != (SPxOut *)0x0) && (4 < (int)pSVar17->m_verbosity)) {
          local_bc = 5;
          leavebound._0_4_ = pSVar17->m_verbosity;
          (*pSVar17->_vptr_SPxOut[2])();
          pSVar17 = operator<<(this->spxout,"IENTER01 factorization triggered in ");
          pSVar17 = operator<<(pSVar17,"enter() for feasibility test");
          std::endl<char,std::char_traits<char>>(pSVar17->m_streams[pSVar17->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&leavebound);
        }
        (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x75])(this);
        return bVar31;
      }
      local_108 = (SVectorBase<double> *)ABS(enterTest);
      uStack_100 = 0;
      dVar11 = entertol(this);
      pSVar17 = this->spxout;
      if ((double)local_108 < dVar11) {
        if ((pSVar17 != (SPxOut *)0x0) && (4 < (int)pSVar17->m_verbosity)) {
          local_bc = 5;
          leavebound._0_4_ = pSVar17->m_verbosity;
          (*pSVar17->_vptr_SPxOut[2])();
          pSVar17 = operator<<(this->spxout,"IENTER11 clean up step to reduce numerical errors");
          std::endl<char,std::char_traits<char>>(pSVar17->m_streams[pSVar17->m_verbosity]);
          (*this->spxout->_vptr_SPxOut[2])(this->spxout,&leavebound);
        }
        SPxBasisBase<double>::coSolve
                  (&this->super_SPxBasisBase<double>,&this->theCoPvec->super_VectorBase<double>,
                   this->theCoPrhs);
        computePvec(this);
        computeCoTest(this);
        computeTest(this);
        return bVar31;
      }
      if ((pSVar17 != (SPxOut *)0x0) && (4 < (int)pSVar17->m_verbosity)) {
        local_bc = 5;
        leavebound._0_4_ = pSVar17->m_verbosity;
        (*pSVar17->_vptr_SPxOut[2])();
        pSVar17 = operator<<(this->spxout,"IENTER02 unboundedness/infeasibility found in ");
        pSVar17 = operator<<(pSVar17,"enter()");
        std::endl<char,std::char_traits<char>>(pSVar17->m_streams[pSVar17->m_verbosity]);
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&leavebound);
      }
      if (this->theRep != ROW) {
        computePrimalray4Col(this,leaveVal,(SPxId)*local_110);
        if (this->m_status == OPTIMAL) {
          this->m_status = UNKNOWN;
        }
        if ((this->super_SPxBasisBase<double>).thestatus == UNBOUNDED) {
          return bVar31;
        }
        (this->super_SPxBasisBase<double>).thestatus = UNBOUNDED;
        return bVar31;
      }
      computeDualfarkas4Row(this,leaveVal,(SPxId)*local_110);
      if (this->m_status == OPTIMAL) {
        this->m_status = UNKNOWN;
      }
      if ((this->super_SPxBasisBase<double>).thestatus == INFEASIBLE) {
        return bVar31;
      }
      (this->super_SPxBasisBase<double>).thestatus = INFEASIBLE;
      return bVar31;
    }
    DVar24 = *local_110;
    if (bVar1 == false) {
      (this->instableEnterId).super_DataKey = DVar24;
      this->instableEnterVal = enterTest;
      DVar24 = *local_110;
      uVar32 = SUB84(enterTest / 10.0,0);
    }
    else {
      uVar32 = SUB84(enterTest,0);
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x84])
              (uVar32,this,DVar24,(ulong)(uint)enterStat);
    pp_Var18 = (this->super_SPxBasisBase<double>)._vptr_SPxBasisBase;
  }
  pDVar23 = &none.super_DataKey;
  uVar25 = 0xffffffff;
  pSVar20 = (SVectorBase<double> *)0x0;
  pSVar26 = (SSVectorBase<double> *)0x0;
LAB_001f2bb7:
  (**pp_Var18)(&this->super_SPxBasisBase<double>,uVar25,pDVar23,pSVar20,pSVar26);
  return bVar31;
}

Assistant:

bool SPxSolverBase<R>::enter(SPxId& enterId, bool polish)
{
   assert(enterId.isValid());
   assert(type() == ENTER);
   assert(initialized);

   SPxId none;          // invalid id used when enter fails
   R enterTest;      // correct test value of entering var
   R enterUB;        // upper bound of entering variable
   R enterLB;        // lower bound of entering variable
   R enterVal;       // current value of entering variable
   R enterMax;       // maximum value for entering shift
   R enterPric;      // priced value of entering variable
   typename SPxBasisBase<R>::Desc::Status enterStat;      // status of entering variable
   R enterRO;        // rhs/obj of entering variable
   StableSum<R> objChange;
   const SVectorBase<R>* enterVec = enterVector(enterId);

   bool instable = instableEnter;
   assert(!instable || instableEnterId.isValid());

   getEnterVals(enterId, enterTest, enterUB, enterLB,
                enterVal, enterMax, enterPric, enterStat, enterRO, objChange);

   if(!polish && enterTest > -epsilon())
   {
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      SPxOut::debug(this, "DENTER08 rejecting false enter pivot\n");

      return false;
   }

   /*  Before performing the actual basis update, we must determine, how this
       is to be accomplished.
   */
   // BH 2005-11-15: Obviously solve4update() is only called if theFvec.delta()
   // is setup (i.e. the indices of the NZEs are stored within it) and there are
   // 0 NZEs (???).
   // In that case theFvec->delta() is set such that
   //   Base * theFvec->delta() = enterVec
   if(theFvec->delta().isSetup() && theFvec->delta().size() == 0)
      SPxBasisBase<R>::solve4update(theFvec->delta(), *enterVec);

#ifdef ENABLE_ADDITIONAL_CHECKS
   else
   {
      // BH 2005-11-29: This code block seems to check the assertion
      //   || Base * theFvec->delta() - enterVec ||_2 <= entertol()
      VectorBase<R> tmp(dim());
      // BH 2005-11-15: This cast is necessary since SSVectorBase<R>  inherits protected from VectorBase<R>.
      tmp = reinterpret_cast<VectorBase<R>&>(theFvec->delta());
      this->multBaseWith(tmp);
      tmp -= *enterVec;

      if(tmp.length() > entertol())
      {
         // This happens frequently and does usually not hurt, so print these
         // warnings only with verbose level INFO2 and higher.
         SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "WENTER09 fVec updated error = "
                       << tmp.length() << std::endl;)
      }
   }

#endif  // ENABLE_ADDITIONAL_CHECKS

   if(!polish && m_numCycle > m_maxCycle)
   {
      if(-enterMax > 0)
         perturbMaxEnter();
      else
         perturbMinEnter();
   }

   R leaveVal = -enterMax;

   boundflips = 0;
   int leaveIdx = theratiotester->selectLeave(leaveVal, enterTest, polish);

   /* in row representation, fixed columns and rows should not leave the basis */
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxColId()
          || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);
   assert(leaveIdx < 0 || !this->baseId(leaveIdx).isSPxRowId()
          || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
          SPxBasisBase<R>::Desc::P_FIXED);

   instableEnterVal = 0;
   instableEnterId = SPxId();
   instableEnter = false;

   /*
     We now tried to find a variable to leave the basis. If one has been
     found, a regular basis update is to be performed.
   */
   if(leaveIdx >= 0)
   {
      if(spxAbs(leaveVal) < entertol())
      {
         if(NE(theUBbound[leaveIdx], theLBbound[leaveIdx], this->tolerances()->epsilon())
               && enterStat != SPxBasisBase<R>::Desc::P_FREE && enterStat != SPxBasisBase<R>::Desc::D_FREE)
         {
            m_numCycle++;
            enterCycles++;
         }
      }
      else
         m_numCycle /= 2;

      // setup for updating the copricing vector
      if(coSolveVector3 && coSolveVector2)
      {
         assert(coSolveVector2->isConsistent());
         assert(coSolveVector2rhs->isSetup());
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, *coSolveVector3
                                  , unitVecs[leaveIdx], *coSolveVector2rhs, *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector3)
      {
         assert(coSolveVector3->isConsistent());
         assert(coSolveVector3rhs->isSetup());
         assert(boundflips > 0);
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector3, unitVecs[leaveIdx],
                                  *coSolveVector3rhs);
         (*theCoPvec) -= (*coSolveVector3);
      }
      else if(coSolveVector2)
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), *coSolveVector2, unitVecs[leaveIdx],
                                  *coSolveVector2rhs);
      else
         SPxBasisBase<R>::coSolve(theCoPvec->delta(), unitVecs[leaveIdx]);

      if(boundflips > 0)
      {
         for(int i = coSolveVector3->dim() - 1; i >= 0; --i)
         {
            if(spxAbs((*coSolveVector3)[i]) > epsilon())
               (*thePvec).multAdd(-(*coSolveVector3)[i], (*thecovectors)[i]);
         }

         // we need to update enterPric in case it was changed by bound flips
         if(enterId.isSPxColId())
            enterPric = (*theCoPvec)[this->number(SPxColId(enterId))];
         else
            enterPric = (*thePvec)[this->number(SPxRowId(enterId))];

         SPxOut::debug(this, "IEBFRT02 breakpoints passed / bounds flipped = {}\n", boundflips);
         totalboundflips += boundflips;
      }

      (*theCoPrhs)[leaveIdx] = enterRO;
      theCoPvec->value() = (enterRO - enterPric) / theFvec->delta()[leaveIdx];

      if(theCoPvec->value() > epsilon() || theCoPvec->value() < -epsilon())
      {
         if(pricing() == FULL)
         {
            thePvec->value() = theCoPvec->value();
            setupPupdate();
         }

         doPupdate();
      }

      assert(thePvec->isConsistent());
      assert(theCoPvec->isConsistent());

      assert(!this->baseId(leaveIdx).isSPxRowId()
             || this->desc().rowStatus(this->number(SPxRowId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);
      assert(!this->baseId(leaveIdx).isSPxColId()
             || this->desc().colStatus(this->number(SPxColId(this->baseId(leaveIdx)))) !=
             SPxBasisBase<R>::Desc::P_FIXED);

      R leavebound;             // bound on which leaving variable moves

      try
      {
         getEnterVals2(leaveIdx, enterMax, leavebound, objChange);
      }
      catch(const SPxException& F)
      {
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
         throw F;
      }

      //  process entering variable
      theUBbound[leaveIdx] = enterUB;
      theLBbound[leaveIdx] = enterLB;

      //  compute tests:
      updateCoTest();

      if(pricing() == FULL)
         updateTest();

      // update feasibility vectors
      theFvec->value() = leaveVal;
      theFvec->update();
      (*theFvec)[leaveIdx] = enterVal - leaveVal;

      if(leavebound > epsilon() || leavebound < -epsilon())
         theFrhs->multAdd(-leavebound, this->baseVec(leaveIdx));

      if(enterVal > epsilon() || enterVal < -epsilon())
         theFrhs->multAdd(enterVal, *enterVec);

      // update objective funtion value
      updateNonbasicValue(objChange);

      //  change basis matrix
      this->change(leaveIdx, enterId, enterVec, &(theFvec->delta()));

      return true;
   }
   /*  No leaving vector could be found that would yield a stable pivot step.
    */
   else if(NE(leaveVal, -enterMax, this->tolerances()->epsilon()))
   {
      /* In the ENTER algorithm, when for a selected entering variable we find only
         an instable leaving variable, then the basis change is not conducted.
         Instead, we save the entering variable's id in instableEnterId and set
         the test value to zero, hoping to find a different leaving
         variable with a stable leavingvariable.
         If this fails, however, and no more entering variable is found, we have to
         perform the instable basis change using instableEnterId. In this (and only
         in this) case, the flag instableEnter is set to true.

         leaveVal != enterMax is the case that selectLeave has found only an instable leaving
         variable. We store this leaving variable for later if we are not already in the
         instable case */

      if(!instable)
      {
         instableEnterId = enterId;
         instableEnterVal = enterTest;

         SPxOut::debug(this, "DENTER09 rejecting enter pivot and looking for others\n");

         rejectEnter(enterId, enterTest / 10.0, enterStat);
         this->change(-1, none, nullptr);
      }
      else
      {
         SPxOut::debug(this, "DENTER10 rejecting enter pivot in instable state, resetting values\n");
         rejectEnter(enterId, enterTest, enterStat);
         this->change(-1, none, nullptr);
      }

      return false;
   }
   /*  No leaving vector has been selected from the basis. However, if the
       shift amount for |fVec| is bounded, we are in the case, that the
       entering variable is moved from one bound to its other, before any of
       the basis feasibility variables reaches their bound. This may only
       happen in primal/columnwise case with upper and lower bounds on
       variables.
   */
   else if(!polish && leaveVal < R(infinity) && leaveVal > R(-infinity))
   {
      assert(rep() == COLUMN);
      assert(EQ(leaveVal, -enterMax, this->epsilon()));

      this->change(-1, enterId, enterVec);

      theFvec->value() = leaveVal;
      theFvec->update();

      ungetEnterVal(enterId, enterStat, leaveVal, *enterVec, objChange);

      // update objective funtion value
      updateNonbasicValue(objChange);

      SPxOut::debug(this, "DENTER11 moving entering variable from one bound to the other\n");

      return false;
   }
   /*  No variable could be selected to leave the basis and even the entering
       variable is unbounded --- this is a failure.
   */
   else
   {
      /* The following line originally was in the "lastUpdate() > 1" case;
         we need it in the INFEASIBLE/UNBOUNDED case, too, to have the
         basis descriptor at the correct size.
      */
      rejectEnter(enterId, enterTest, enterStat);
      this->change(-1, none, nullptr);

      if(polish)
         return false;

      else if(this->lastUpdate() > 1)
      {
         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER01 factorization triggered in "
                       << "enter() for feasibility test" << std::endl;)

         try
         {
            factorize();
         }
         catch(const SPxStatusException& E)
         {
            // don't exit immediately but handle the singularity correctly
            assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::SINGULAR);
            SPX_MSG_INFO3((*this->spxout),
                          (*this->spxout) << "Caught exception in factorization: " << E.what() <<
                          std::endl;)
         }

         /* after a factorization, the entering column/row might not be infeasible or suboptimal anymore, hence we do
          * not try to call leave(leaveIdx), but rather return to the main solving loop and call the pricer again
          */
         return false;
      }

      /* do not exit with status infeasible or unbounded if there is only a very small violation
       * ROW: recompute the primal variables and activities for another, more precise, round of pricing
       */
      else if(spxAbs(enterTest) < entertol())
      {
         SPX_MSG_INFO3((*this->spxout),
                       (*this->spxout) << "IENTER11 clean up step to reduce numerical errors" <<
                       std::endl;)

         SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
         computePvec();
         computeCoTest();
         computeTest();

         return false;
      }

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "IENTER02 unboundedness/infeasibility found in "
                    << "enter()" << std::endl;)

      if(rep() == ROW)
      {
         computeDualfarkas4Row(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
      }
      /**@todo if shift() is not zero, we must not conclude primal unboundedness */
      else
      {
         computePrimalray4Col(leaveVal, enterId);
         setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
      }

      return false;
   }
}